

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Valuator.cxx
# Opt level: O2

void __thiscall Fl_Valuator::step(Fl_Valuator *this,double s)

{
  uint uVar1;
  double dVar2;
  double __x;
  
  __x = -s;
  if (-s <= s) {
    __x = s;
  }
  dVar2 = rint(__x);
  this->A = dVar2;
  this->B = 1;
  uVar1 = 1;
  while( true ) {
    if ((ABS(__x - dVar2 / (double)(int)uVar1) <= 4.66e-10) || (0xccccccc < uVar1)) break;
    uVar1 = uVar1 * 10;
    this->B = uVar1;
    dVar2 = rint((double)(int)uVar1 * __x);
    this->A = dVar2;
  }
  return;
}

Assistant:

void Fl_Valuator::step(double s) {
  if (s < 0) s = -s;
  A = rint(s);
  B = 1;
  while (fabs(s-A/B) > epsilon && B<=(0x7fffffff/10)) {B *= 10; A = rint(s*B);}
}